

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_cert.cc
# Opt level: O0

int SSL_set_signed_cert_timestamp_list(SSL *ssl,uint8_t *list,size_t list_len)

{
  bool bVar1;
  int iVar2;
  CRYPTO_BUFFER *__p;
  pointer pSVar3;
  pointer pCVar4;
  pointer cred;
  pointer sct_list;
  bool local_3d;
  unique_ptr<crypto_buffer_st,_bssl::internal::Deleter> local_30;
  UniquePtr<CRYPTO_BUFFER> buf;
  size_t list_len_local;
  uint8_t *list_local;
  SSL *ssl_local;
  
  buf._M_t.super___uniq_ptr_impl<crypto_buffer_st,_bssl::internal::Deleter>._M_t.
  super__Tuple_impl<0UL,_crypto_buffer_st_*,_bssl::internal::Deleter>.
  super__Head_base<0UL,_crypto_buffer_st_*,_false>._M_head_impl =
       (__uniq_ptr_data<crypto_buffer_st,_bssl::internal::Deleter,_true,_true>)
       (__uniq_ptr_data<crypto_buffer_st,_bssl::internal::Deleter,_true,_true>)list_len;
  bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&ssl->config);
  if (bVar1) {
    __p = CRYPTO_BUFFER_new(list,(size_t)buf._M_t.
                                         super___uniq_ptr_impl<crypto_buffer_st,_bssl::internal::Deleter>
                                         ._M_t.
                                         super__Tuple_impl<0UL,_crypto_buffer_st_*,_bssl::internal::Deleter>
                                         .super__Head_base<0UL,_crypto_buffer_st_*,_false>.
                                         _M_head_impl,(CRYPTO_BUFFER_POOL *)0x0);
    std::unique_ptr<crypto_buffer_st,bssl::internal::Deleter>::
    unique_ptr<bssl::internal::Deleter,void>
              ((unique_ptr<crypto_buffer_st,bssl::internal::Deleter> *)&local_30,__p);
    bVar1 = std::operator!=(&local_30,(nullptr_t)0x0);
    local_3d = false;
    if (bVar1) {
      pSVar3 = std::unique_ptr<bssl::SSL_CONFIG,_bssl::internal::Deleter>::operator->(&ssl->config);
      pCVar4 = std::unique_ptr<bssl::CERT,_bssl::internal::Deleter>::operator->(&pSVar3->cert);
      cred = std::unique_ptr<ssl_credential_st,_bssl::internal::Deleter>::get
                       (&pCVar4->legacy_credential);
      sct_list = std::unique_ptr<crypto_buffer_st,_bssl::internal::Deleter>::get(&local_30);
      iVar2 = SSL_CREDENTIAL_set1_signed_cert_timestamp_list(cred,sct_list);
      local_3d = iVar2 != 0;
    }
    ssl_local._4_4_ = (uint)local_3d;
    std::unique_ptr<crypto_buffer_st,_bssl::internal::Deleter>::~unique_ptr(&local_30);
  }
  else {
    ssl_local._4_4_ = 0;
  }
  return ssl_local._4_4_;
}

Assistant:

int SSL_set_signed_cert_timestamp_list(SSL *ssl, const uint8_t *list,
                                       size_t list_len) {
  if (!ssl->config) {
    return 0;
  }
  UniquePtr<CRYPTO_BUFFER> buf(CRYPTO_BUFFER_new(list, list_len, nullptr));
  return buf != nullptr &&
         SSL_CREDENTIAL_set1_signed_cert_timestamp_list(
             ssl->config->cert->legacy_credential.get(), buf.get());
}